

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void BM_Check1(int n)

{
  CheckOpString local_78;
  LogMessage local_70;
  
  do {
    if (n < 1) {
      return;
    }
    n = n + -1;
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_78.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7d,&local_78);
      google::LogMessage::stream(&local_70);
      goto LAB_00109e12;
    }
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_78.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7e,&local_78);
      google::LogMessage::stream(&local_70);
      goto LAB_00109e12;
    }
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_78.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7f,&local_78);
      google::LogMessage::stream(&local_70);
      goto LAB_00109e12;
    }
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_78.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x80,&local_78);
      google::LogMessage::stream(&local_70);
      goto LAB_00109e12;
    }
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_78.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x81,&local_78);
      google::LogMessage::stream(&local_70);
      goto LAB_00109e12;
    }
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_78.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x82,&local_78);
      google::LogMessage::stream(&local_70);
      goto LAB_00109e12;
    }
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
    if (local_78.str_ != (string *)0x0) {
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x83,&local_78);
      google::LogMessage::stream(&local_70);
      goto LAB_00109e12;
    }
    local_78.str_ = google::Check_GEImpl_abi_cxx11_(n,x - 1 | 5,"n >= x");
  } while (local_78.str_ == (string *)0x0);
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x84,&local_78);
  google::LogMessage::stream(&local_70);
LAB_00109e12:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_70);
}

Assistant:

static void BM_Check1(int n) {
  while (n-- > 0) {
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
  }
}